

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hand_rolled_vtable.hpp
# Opt level: O2

void * printable_vtable::clone_impl<large_printable>(void *value)

{
  vector<double,_std::allocator<double>_> *this;
  
  this = (vector<double,_std::allocator<double>_> *)operator_new(0x2018);
  std::vector<double,_std::allocator<double>_>::vector
            (this,(vector<double,_std::allocator<double>_> *)value);
  return this;
}

Assistant:

static void * clone_impl (void * value)
    { return new ValueType(*static_cast<ValueType*>(value)); }